

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho_corasick.cpp
# Opt level: O0

void __thiscall Trie::createChild(Trie *this,char c)

{
  int iVar1;
  Trie *this_00;
  Trie *local_38;
  __normal_iterator<Trie_**,_std::vector<Trie_*,_std::allocator<Trie_*>_>_> local_30;
  __normal_iterator<Trie_**,_std::vector<Trie_*,_std::allocator<Trie_*>_>_> local_28;
  const_iterator local_20;
  char local_11;
  Trie *pTStack_10;
  char c_local;
  Trie *this_local;
  
  local_11 = c;
  pTStack_10 = this;
  local_30._M_current = (Trie **)std::vector<Trie_*,_std::allocator<Trie_*>_>::begin(&this->sons);
  iVar1 = childIndex(this,local_11);
  local_28 = __gnu_cxx::__normal_iterator<Trie_**,_std::vector<Trie_*,_std::allocator<Trie_*>_>_>::
             operator+(&local_30,(long)iVar1);
  __gnu_cxx::__normal_iterator<Trie*const*,std::vector<Trie*,std::allocator<Trie*>>>::
  __normal_iterator<Trie**>
            ((__normal_iterator<Trie*const*,std::vector<Trie*,std::allocator<Trie*>>> *)&local_20,
             &local_28);
  this_00 = (Trie *)operator_new(0x40);
  Trie(this_00,local_11);
  local_38 = this_00;
  std::vector<Trie_*,_std::allocator<Trie_*>_>::insert(&this->sons,local_20,&local_38);
  iVar1 = normalize(local_11);
  this->bitmask = 1L << ((byte)iVar1 & 0x3f) | this->bitmask;
  return;
}

Assistant:

inline void createChild(char c) {
		sons.insert(sons.begin() + childIndex(c), new Trie(c));  // maintain ordering
		bitmask |= (1LL << normalize(c));
	}